

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O1

Expression * __thiscall
soul::heart::Parser::parseArraySlice
          (Parser *this,FunctionParseState *state,Expression *lhs,int64_t start,int64_t end)

{
  Module *pMVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ArrayElement *lhs_00;
  Expression *pEVar4;
  CompileMessage local_70;
  unsigned_long local_38;
  
  iVar3 = (*(lhs->super_Object)._vptr_Object[2])(lhs);
  if ((*(byte *)CONCAT44(extraout_var,iVar3) & 0xfe) != 2) {
    CompileMessageHelpers::createMessage<>
              (&local_70,syntax,error,"The target for this expression is not an array");
    (*(this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser[2])(this,&local_70);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_70.location.sourceCode.object);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.description._M_dataplus._M_p != &local_70.description.field_2) {
      operator_delete(local_70.description._M_dataplus._M_p,
                      local_70.description.field_2._M_allocated_capacity + 1);
    }
  }
  iVar3 = (*(lhs->super_Object)._vptr_Object[2])(lhs);
  bVar2 = Type::isValidArrayOrVectorRange<long>((Type *)CONCAT44(extraout_var_00,iVar3),start,end);
  if (!bVar2) {
    CompileMessageHelpers::createMessage<>(&local_70,syntax,error,"Invalid array slice range");
    (*(this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser[2])(this,&local_70);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_70.location.sourceCode.object);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.description._M_dataplus._M_p != &local_70.description.field_2) {
      operator_delete(local_70.description._M_dataplus._M_p,
                      local_70.description.field_2._M_allocated_capacity + 1);
    }
  }
  pMVar1 = (this->module).object;
  if (pMVar1 != (Module *)0x0) {
    local_70.description._M_dataplus._M_p = (pointer)start;
    local_38 = end;
    lhs_00 = PoolAllocator::
             allocate<soul::heart::ArrayElement,soul::CodeLocation&,soul::heart::Expression&,unsigned_long,unsigned_long>
                       (&pMVar1->allocator->pool,
                        &(this->
                         super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                         ).location,lhs,(unsigned_long *)&local_70,&local_38);
    pEVar4 = parseSuffixOperators(this,state,&lhs_00->super_Expression);
    return pEVar4;
  }
  throwInternalCompilerError("object != nullptr","operator->",0x3c);
}

Assistant:

heart::Expression& parseArraySlice (const FunctionParseState& state, heart::Expression& lhs, int64_t start, int64_t end)
    {
        if (! lhs.getType().isArrayOrVector())
            throwError (Errors::targetIsNotAnArray());

        if (! lhs.getType().isValidArrayOrVectorRange (start, end))
            throwError (Errors::illegalSliceSize());

        auto& s = module->allocate<heart::ArrayElement> (location, lhs, (size_t) start, (size_t) end);
        return parseSuffixOperators (state, s);
    }